

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O3

void __thiscall
glcts::BlendTestCaseGroup::BlendTest::getTestColors(BlendTest *this,int index,Vec4 *src,Vec4 *dst)

{
  GLfloat *pGVar1;
  float fVar2;
  GLfloat *pGVar3;
  GLfloat GVar4;
  GLfloat GVar5;
  GLfloat GVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar13;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  int iVar19;
  undefined1 auVar20 [12];
  long lVar8;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  lVar8 = CONCAT44(extraout_var,iVar7);
  pGVar3 = this->m_colors;
  iVar7 = *(int *)(lVar8 + 0xc);
  iVar19 = *(int *)(lVar8 + 0x10);
  uVar14 = -(uint)(0 < *(int *)(lVar8 + 0x14));
  pGVar1 = pGVar3 + (index << 3);
  GVar4 = pGVar1[1];
  GVar5 = pGVar1[2];
  GVar6 = pGVar1[3];
  src->m_data[0] = (float)((uint)*pGVar1 & -(uint)(0 < *(int *)(lVar8 + 8)));
  src->m_data[1] = (float)((uint)GVar4 & -(uint)(0 < iVar7));
  src->m_data[2] = (float)((uint)GVar5 & -(uint)(0 < iVar19));
  src->m_data[3] = (float)(~uVar14 & 0x3f800000 | (uint)GVar6 & uVar14);
  iVar7 = *(int *)(lVar8 + 0xc);
  iVar19 = *(int *)(lVar8 + 0x10);
  uVar14 = -(uint)(0 < *(int *)(lVar8 + 0x14));
  pGVar3 = pGVar3 + (long)(index << 3) + 4;
  GVar4 = pGVar3[1];
  GVar5 = pGVar3[2];
  GVar6 = pGVar3[3];
  dst->m_data[0] = (float)((uint)*pGVar3 & -(uint)(0 < *(int *)(lVar8 + 8)));
  dst->m_data[1] = (float)((uint)GVar4 & -(uint)(0 < iVar7));
  dst->m_data[2] = (float)((uint)GVar5 & -(uint)(0 < iVar19));
  dst->m_data[3] = (float)(~uVar14 & 0x3f800000 | (uint)GVar6 & uVar14);
  auVar15 = _DAT_01a1c5b0;
  auVar9 = *(undefined1 (*) [16])src->m_data;
  auVar16 = minps(_DAT_01a1c5b0,auVar9);
  src->m_data[0] = (float)(-(uint)(0.0 <= auVar9._0_4_) & auVar16._0_4_);
  src->m_data[1] = (float)(-(uint)(0.0 <= auVar9._4_4_) & auVar16._4_4_);
  src->m_data[2] = (float)(-(uint)(0.0 <= auVar9._8_4_) & auVar16._8_4_);
  src->m_data[3] = (float)(-(uint)(0.0 <= auVar9._12_4_) & auVar16._12_4_);
  auVar9 = *(undefined1 (*) [16])dst->m_data;
  auVar15 = minps(auVar15,auVar9);
  dst->m_data[0] = (float)(-(uint)(0.0 <= auVar9._0_4_) & auVar15._0_4_);
  dst->m_data[1] = (float)(-(uint)(0.0 <= auVar9._4_4_) & auVar15._4_4_);
  dst->m_data[2] = (float)(-(uint)(0.0 <= auVar9._8_4_) & auVar15._8_4_);
  dst->m_data[3] = (float)(-(uint)(0.0 <= auVar9._12_4_) & auVar15._12_4_);
  fVar2 = dst->m_data[2];
  if (*(int *)(lVar8 + 0x14) == 0) {
    fVar17 = 1.0;
  }
  else {
    fVar17 = (float)(1 << ((byte)*(int *)(lVar8 + 0x14) & 0x1f)) + -1.0;
    fVar17 = (float)((long)(dst->m_data[3] * fVar17) & 0xffffffff) / fVar17;
  }
  fVar18 = (float)(1 << ((byte)*(undefined4 *)(lVar8 + 0x10) & 0x1f)) + -1.0;
  auVar16._0_4_ =
       (float)(int)(float)((int)*(undefined8 *)(lVar8 + 8) * 0x800000 + 0x3f800000) + -1.0;
  auVar16._4_4_ =
       (float)(int)(float)((int)((ulong)*(undefined8 *)(lVar8 + 8) >> 0x20) * 0x800000 + 0x3f800000)
       + -1.0;
  auVar16._8_8_ = 0;
  fVar10 = (float)*(undefined8 *)dst->m_data * auVar16._0_4_;
  fVar13 = (float)((ulong)*(undefined8 *)dst->m_data >> 0x20) * auVar16._4_4_;
  iVar7 = (int)fVar10;
  iVar19 = (int)fVar13;
  auVar20._0_4_ = iVar7 >> 0x1f;
  auVar20._4_4_ = iVar19 >> 0x1f;
  auVar20._8_4_ = 0;
  auVar11._0_4_ = (int)(fVar10 - 2.1474836e+09);
  auVar11._4_4_ = (int)(fVar13 - 2.1474836e+09);
  auVar11._8_4_ = 0x80000000;
  auVar12._4_4_ = iVar19;
  auVar12._0_4_ = iVar7;
  auVar12._8_4_ = 0;
  auVar12 = auVar11 & auVar20 | auVar12;
  auVar15._0_8_ = auVar12._0_8_ & 0xffffffff;
  auVar15._8_4_ = auVar12._4_4_;
  auVar15._12_4_ = 0;
  auVar9._0_4_ = (float)(SUB168(auVar15 | _DAT_01a91940,0) - (double)DAT_01a91940);
  auVar9._4_4_ = (float)(SUB168(auVar15 | _DAT_01a91940,8) - DAT_01a91940._8_8_);
  auVar9._8_8_ = 0;
  auVar9 = divps(auVar9,auVar16);
  *(long *)dst->m_data = auVar9._0_8_;
  dst->m_data[2] = (float)((long)(fVar2 * fVar18) & 0xffffffff) / fVar18;
  dst->m_data[3] = fVar17;
  return;
}

Assistant:

void BlendTestCaseGroup::BlendTest::getTestColors(int index, tcu::Vec4& src, tcu::Vec4& dst) const
{
	DE_ASSERT(0 <= index && index < m_numColors);

	const tcu::RenderTarget& rt = m_context.getRenderContext().getRenderTarget();
	const tcu::PixelFormat&  pf = rt.getPixelFormat();
	const glw::GLfloat*		 s  = m_colors + 8 * index;

	src = MaskChannels(pf, tcu::Vec4(s[0], s[1], s[2], s[3]));
	dst = MaskChannels(pf, tcu::Vec4(s[4], s[5], s[6], s[7]));
	src = tcu::clamp(src, tcu::Vec4(0.f), tcu::Vec4(1.f));
	dst = tcu::clamp(dst, tcu::Vec4(0.f), tcu::Vec4(1.f));

	// Quantize the destination channels
	// this matches what implementation does on render target write
	dst = QuantizeChannels(pf, dst);
}